

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O3

void Imath_3_2::transform<float,float>
               (Box<Imath_3_2::Vec3<float>_> *box,Matrix44<float> *m,
               Box<Imath_3_2::Vec3<float>_> *result)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar8;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int i;
  long lVar9;
  float *pfVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float afStack_70 [2];
  Vec3<float> points [8];
  
  points[3].x = (box->min).x;
  points[7].x = (box->max).x;
  if (points[3].x <= points[7].x) {
    points[5].y = (box->min).y;
    points[7].y = (box->max).y;
    if (points[5].y <= points[7].y) {
      points[6].z = (box->min).z;
      points[7].z = (box->max).z;
      if ((points[6].z <= points[7].z) &&
         (((((((points[7].x != 3.4028235e+38 || (NAN(points[7].x))) ||
              (points[3].x != -3.4028235e+38)) ||
             ((NAN(points[3].x) || (points[5].y != -3.4028235e+38)))) ||
            ((NAN(points[5].y) || ((points[7].y != 3.4028235e+38 || (NAN(points[7].y))))))) ||
           (points[6].z != -3.4028235e+38)) ||
          (((NAN(points[6].z) || (points[7].z != 3.4028235e+38)) || (NAN(points[7].z))))))) {
        fVar14 = m->x[0][3];
        if ((((fVar14 != 0.0) || (NAN(fVar14))) ||
            ((fVar14 = m->x[1][3], fVar14 != 0.0 ||
             ((NAN(fVar14) || (fVar14 = m->x[2][3], fVar14 != 0.0)))))) ||
           ((NAN(fVar14) || ((fVar14 = m->x[3][3], fVar14 != 1.0 || (NAN(fVar14))))))) {
          points[2].x = points[3].x;
          points[1].x = points[3].x;
          points[0].x = points[3].x;
          points[6].x = points[7].x;
          points[5].x = points[7].x;
          points[4].x = points[7].x;
          points[4].y = points[5].y;
          points[1].y = points[5].y;
          points[0].y = points[5].y;
          points[6].y = points[7].y;
          points[3].y = points[7].y;
          points[2].y = points[7].y;
          points[4].z = points[6].z;
          points[2].z = points[6].z;
          points[0].z = points[6].z;
          points[5].z = points[7].z;
          points[3].z = points[7].z;
          points[1].z = points[7].z;
          fVar14 = (result->min).x;
          fVar17 = (result->min).y;
          fVar19 = (result->min).z;
          fVar18 = (result->max).x;
          uVar3 = (result->max).y;
          uVar8 = (result->max).z;
          uVar15 = 0;
          uVar16 = 0;
          lVar9 = 8;
          do {
            fVar22 = *(float *)((long)afStack_70 + lVar9);
            fVar1 = *(float *)((long)afStack_70 + lVar9 + 4);
            fVar2 = *(float *)((long)&points[0].x + lVar9);
            fVar24 = m->x[3][3] + m->x[2][3] * fVar2 + m->x[0][3] * fVar22 + m->x[1][3] * fVar1;
            uVar4 = *(undefined8 *)(m->x[0] + 1);
            uVar5 = *(undefined8 *)(m->x[1] + 1);
            uVar6 = *(undefined8 *)(m->x[2] + 1);
            auVar23._4_4_ = fVar24;
            auVar23._0_4_ = fVar24;
            auVar23._8_4_ = fVar24;
            auVar23._12_4_ = fVar24;
            uVar7 = *(undefined8 *)(m->x[3] + 1);
            fVar24 = (m->x[3][0] + m->x[2][0] * fVar2 + m->x[0][0] * fVar22 + m->x[1][0] * fVar1) /
                     fVar24;
            auVar20._0_4_ =
                 (float)uVar7 + (float)uVar6 * fVar2 + (float)uVar4 * fVar22 + (float)uVar5 * fVar1;
            auVar20._4_4_ =
                 (float)((ulong)uVar7 >> 0x20) +
                 (float)((ulong)uVar6 >> 0x20) * fVar2 +
                 (float)((ulong)uVar4 >> 0x20) * fVar22 + (float)((ulong)uVar5 >> 0x20) * fVar1;
            auVar20._8_4_ = fVar2 * 0.0 + fVar22 * 0.0 + fVar1 * 0.0 + 0.0;
            auVar20._12_4_ = fVar2 * 0.0 + fVar22 * 0.0 + fVar1 * 0.0 + 0.0;
            auVar20 = divps(auVar20,auVar23);
            uVar12 = -(uint)(auVar20._0_4_ < fVar17);
            uVar13 = -(uint)(auVar20._4_4_ < fVar19);
            fVar14 = (float)(~-(uint)(fVar24 < fVar14) & (uint)fVar14 |
                            (uint)fVar24 & -(uint)(fVar24 < fVar14));
            fVar17 = (float)(~uVar12 & (uint)fVar17 | (uint)auVar20._0_4_ & uVar12);
            fVar19 = (float)(~uVar13 & (uint)fVar19 | (uint)auVar20._4_4_ & uVar13);
            fVar18 = (float)(~-(uint)(fVar18 < fVar24) & (uint)fVar18 |
                            (uint)fVar24 & -(uint)(fVar18 < fVar24));
            (result->min).x = fVar14;
            (result->min).y = fVar17;
            (result->min).z = fVar19;
            (result->max).x = fVar18;
            auVar21._4_4_ = uVar8;
            auVar21._0_4_ = uVar3;
            auVar21._8_4_ = uVar15;
            auVar21._12_4_ = uVar16;
            auVar21 = maxps(auVar20,auVar21);
            (result->max).y = (float)(int)auVar21._0_8_;
            (result->max).z = (float)(int)((ulong)auVar21._0_8_ >> 0x20);
            lVar9 = lVar9 + 0xc;
            uVar3 = auVar21._0_4_;
            uVar8 = auVar21._4_4_;
            uVar15 = auVar21._8_4_;
            uVar16 = auVar21._12_4_;
          } while (lVar9 != 0x68);
        }
        else {
          lVar9 = 0;
          pfVar10 = (float *)m;
          do {
            fVar14 = m->x[3][lVar9];
            (&(result->max).x)[lVar9] = fVar14;
            (&(result->min).x)[lVar9] = fVar14;
            lVar11 = 0;
            fVar17 = fVar14;
            do {
              fVar22 = *(float *)((long)&(box->min).x + lVar11) * pfVar10[lVar11];
              fVar19 = pfVar10[lVar11] * *(float *)((long)&(box->max).x + lVar11);
              fVar18 = fVar22;
              if (fVar19 <= fVar22) {
                fVar18 = fVar19;
              }
              fVar14 = fVar14 + fVar18;
              if (fVar19 <= fVar22) {
                fVar19 = fVar22;
              }
              fVar17 = fVar17 + fVar19;
              (&(result->min).x)[lVar9] = fVar14;
              (&(result->max).x)[lVar9] = fVar17;
              lVar11 = lVar11 + 4;
            } while (lVar11 != 0xc);
            lVar9 = lVar9 + 1;
            pfVar10 = pfVar10 + 1;
          } while (lVar9 != 3);
        }
      }
    }
  }
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline bool
Box<Vec3<T>>::isEmpty () const IMATH_NOEXCEPT
{
    return (max.x < min.x || max.y < min.y || max.z < min.z);
}